

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

int __thiscall Random_keys::avancaGeracoes2(Random_keys *this,Graph *g)

{
  int iVar1;
  RK_Individual *pRVar2;
  RK_Individual *pai2_00;
  int iVar3;
  int iVar4;
  reference ppRVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  int local_68;
  int local_64;
  int i_1;
  int pai2;
  int aux;
  int cand3;
  int cand2;
  int cand1;
  int pai1;
  int i;
  int num_melhores;
  int num_piores;
  RK_Individual *best_1;
  double dStack_30;
  int k;
  double perda;
  RK_Individual *best;
  int melhorGeracao;
  Graph *g_local;
  Random_keys *this_local;
  
  best._4_4_ = 0;
  ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                      (&this->popAtual,(long)(this->tamPop + -1));
  pRVar2 = *ppRVar5;
  ordenaPopulacaoAtual(this,g);
  dStack_30 = RK_Individual::getActiveLoss(pRVar2);
  dStack_30 = dStack_30 * 100000.0;
  for (best_1._4_4_ = 0; best_1._4_4_ < this->numGeracoes; best_1._4_4_ = best_1._4_4_ + 1) {
    ordenaPopulacaoAtual(this,g);
    ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                        (&this->popAtual,(long)(this->tamPop + -1));
    pRVar2 = *ppRVar5;
    dVar7 = RK_Individual::getActiveLoss(pRVar2);
    if (dVar7 * 100000.0 < dStack_30) {
      dStack_30 = RK_Individual::getActiveLoss(pRVar2);
      dStack_30 = dStack_30 * 100000.0;
      best._4_4_ = best_1._4_4_;
    }
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
              (&this->popAnterior,&this->popAtual);
    iVar1 = this->tamPop;
    iVar6 = (int)((double)this->tamPop * 0.05);
    for (cand1 = iVar6; cand1 < this->tamPop - (int)((double)iVar1 * 0.1); cand1 = cand1 + 1) {
      rand();
      iVar3 = rand();
      iVar3 = iVar3 % this->tamPop;
      iVar4 = rand();
      aux = iVar4 % this->tamPop;
      iVar4 = rand();
      pai2 = iVar4 % this->tamPop;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)iVar3);
      dVar7 = RK_Individual::getActiveLoss(*ppRVar5);
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)aux);
      dVar8 = RK_Individual::getActiveLoss(*ppRVar5);
      if (dVar7 < dVar8) {
        aux = iVar3;
      }
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)aux);
      dVar7 = RK_Individual::getActiveLoss(*ppRVar5);
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)pai2);
      dVar8 = RK_Individual::getActiveLoss(*ppRVar5);
      if (dVar7 < dVar8) {
        pai2 = aux;
      }
      for (local_64 = pai2; local_64 == pai2; local_64 = local_64 % this->tamPop) {
        local_64 = rand();
      }
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)pai2);
      pRVar2 = *ppRVar5;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)local_64);
      pai2_00 = *ppRVar5;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAtual,(long)cand1);
      cruzamento2(this,pRVar2,pai2_00,*ppRVar5);
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAtual,(long)cand1);
      mutacao(this,*ppRVar5);
    }
    for (local_68 = 0; local_68 < iVar6; local_68 = local_68 + 1) {
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAtual,(long)local_68);
      RK_Individual::generate_random_weights(*ppRVar5);
    }
  }
  ordenaPopulacaoAtual(this,g);
  return best._4_4_;
}

Assistant:

int Random_keys::avancaGeracoes2(Graph *g){

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
         e ordena a populacao da maior perda(pior individuo)
         pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /*torneio com 3*/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            int aux = cand1;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }else{aux = cand2;}
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }else{aux = cand3;}
            pai1 = aux;

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia2(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento2(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();
            this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

//    cout << "\n--------------------------------------"<<endl;
//    for(unsigned int i=0; i<popAtual.size(); i++)
//        cout << 100*1000*popAtual.at(i)->getPerdaAtiva() << " , ";
//    cout << "\n--------------------------------------"<<endl;

    this->ordenaPopulacaoAtual(g);

    return melhorGeracao;
}